

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDfs.c
# Opt level: O0

Vec_Int_t * Ivy_ManDfs(Ivy_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  Vec_Int_t *vNodes_00;
  Ivy_Obj_t *pIVar5;
  int local_24;
  int i;
  Ivy_Obj_t *pObj;
  Vec_Int_t *vNodes;
  Ivy_Man_t *p_local;
  
  iVar1 = Ivy_ManLatchNum(p);
  if (iVar1 != 0) {
    __assert_fail("Ivy_ManLatchNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDfs.c"
                  ,0x5c,"Vec_Int_t *Ivy_ManDfs(Ivy_Man_t *)");
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pvVar4 = Vec_PtrEntry(p->vObjs,local_24);
    if ((pvVar4 != (void *)0x0) &&
       (((*(uint *)((long)pvVar4 + 8) >> 4 & 1) != 0 ||
        ((*(uint *)((long)pvVar4 + 8) >> 5 & 1) != 0)))) {
      __assert_fail("!pObj->fMarkA && !pObj->fMarkB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDfs.c"
                    ,0x5f,"Vec_Int_t *Ivy_ManDfs(Ivy_Man_t *)");
    }
  }
  iVar1 = Ivy_ManNodeNum(p);
  vNodes_00 = Vec_IntAlloc(iVar1);
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vPos), local_24 < iVar1; local_24 = local_24 + 1) {
    pIVar5 = (Ivy_Obj_t *)Vec_PtrEntry(p->vPos,local_24);
    pIVar5 = Ivy_ObjFanin0(pIVar5);
    Ivy_ManDfs_rec(p,pIVar5,vNodes_00);
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pIVar5 = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,local_24);
    if (pIVar5 != (Ivy_Obj_t *)0x0) {
      Ivy_ObjClearMarkA(pIVar5);
    }
  }
  iVar1 = Vec_IntSize(vNodes_00);
  iVar2 = Ivy_ManNodeNum(p);
  iVar3 = Ivy_ManBufNum(p);
  if (iVar1 == iVar2 + iVar3) {
    return vNodes_00;
  }
  __assert_fail("Vec_IntSize(vNodes) == Ivy_ManNodeNum(p) + Ivy_ManBufNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDfs.c"
                ,0x6a,"Vec_Int_t *Ivy_ManDfs(Ivy_Man_t *)");
}

Assistant:

Vec_Int_t * Ivy_ManDfs( Ivy_Man_t * p )
{
    Vec_Int_t * vNodes;
    Ivy_Obj_t * pObj;
    int i;
    assert( Ivy_ManLatchNum(p) == 0 );
    // make sure the nodes are not marked
    Ivy_ManForEachObj( p, pObj, i )
        assert( !pObj->fMarkA && !pObj->fMarkB );
    // collect the nodes
    vNodes = Vec_IntAlloc( Ivy_ManNodeNum(p) );
    Ivy_ManForEachPo( p, pObj, i )
        Ivy_ManDfs_rec( p, Ivy_ObjFanin0(pObj), vNodes );
    // unmark the collected nodes
//    Ivy_ManForEachNodeVec( p, vNodes, pObj, i )
//        Ivy_ObjClearMarkA(pObj);
    Ivy_ManForEachObj( p, pObj, i )
        Ivy_ObjClearMarkA(pObj);
    // make sure network does not have dangling nodes
    assert( Vec_IntSize(vNodes) == Ivy_ManNodeNum(p) + Ivy_ManBufNum(p) );
    return vNodes;
}